

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void kratos::auto_insert_sync_reset(Generator *top)

{
  undefined1 local_a8 [8];
  InsertSyncReset visitor;
  
  InsertSyncReset::InsertSyncReset((InsertSyncReset *)local_a8,top);
  IRVisitor::visit_generator_root_p((IRVisitor *)local_a8,top);
  InsertSyncReset::~InsertSyncReset((InsertSyncReset *)local_a8);
  return;
}

Assistant:

void auto_insert_sync_reset(Generator* top) {
    InsertSyncReset visitor(top);
    visitor.visit_generator_root_p(top);
}